

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O2

value object_metadata(object obj)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  size_t length;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string("name",4);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      __s = obj->name;
      length = strlen(__s);
      pvVar2 = value_create_string(__s,length);
      ppvVar1[1] = pvVar2;
      if ((pvVar2 != (value)0x0) &&
         (pvVar2 = value_create_map((value *)0x0,1), pvVar2 != (value)0x0)) {
        ppvVar1 = value_to_map(pvVar2);
        *ppvVar1 = v;
        return pvVar2;
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value object_metadata(object obj)
{
	value name, f;

	value *f_map;

	/* Create object name array */
	name = object_metadata_name(obj);

	if (name == NULL)
	{
		return NULL;
	}

	/* Create object map (name) */
	f = value_create_map(NULL, 1);

	if (f == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	f_map = value_to_map(f);

	f_map[0] = name;

	return f;
}